

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecurityDirWrapper.cpp
# Opt level: O2

QString * __thiscall
SecurityDirWrapper::getFieldName
          (QString *__return_storage_ptr__,SecurityDirWrapper *this,size_t fieldId)

{
  char *ch;
  
  switch(fieldId) {
  case 0:
    ch = "Length";
    break;
  case 1:
    ch = "Revision";
    break;
  case 2:
    ch = "Type";
    break;
  case 3:
    ch = "Cert. Content";
    break;
  default:
    (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
      super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xe])
              (__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  QString::QString(__return_storage_ptr__,ch);
  return __return_storage_ptr__;
}

Assistant:

QString SecurityDirWrapper::getFieldName(size_t fieldId)
{
    switch (fieldId) {
        case CERT_LEN : return "Length";
        case REVISION : return "Revision";
        case TYPE : return "Type";
        case CERT_CONTENT : return "Cert. Content";
    }
    return getName();
}